

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_b6a8b::readFile
               (string *filename,int channelCount,bool bulkRead,bool randomChannels)

{
  LineOrder LVar1;
  Compression CVar2;
  uint uVar3;
  undefined1 uVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  ostream *poVar8;
  Box2i *pBVar9;
  float *pfVar10;
  V2f *this;
  V2f *v;
  LineOrder *pLVar11;
  Compression *pCVar12;
  uint *puVar13;
  reference pvVar14;
  Array2D<void_*> *pAVar15;
  void *pvVar16;
  void **ppvVar17;
  void *pvVar18;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  float fVar19;
  float fVar20;
  int f_2;
  int k_3;
  int j_5;
  int i_6;
  float *value_2;
  half *value_1;
  uint *value;
  uint l;
  int k_2;
  int j_4;
  int i_5;
  int f_1;
  int k_1;
  int j_3;
  int j_2;
  int y;
  int i_4;
  int f;
  int k;
  int j_1;
  int j;
  int i_3;
  string str_1;
  stringstream ss_1;
  int pointerSize_1;
  int sampleSize_1;
  PixelType type_1;
  int i_2;
  int pointerSize;
  int sampleSize;
  string str;
  stringstream ss;
  PixelType type;
  int i_1;
  int channels_added;
  vector<int,_std::allocator<int>_> read_channel;
  DeepFrameBuffer frameBuffer;
  int i;
  Array<Imf_2_5::Array2D<void_*>_> data;
  int fillChannels;
  Array2D<unsigned_int> localSampleCount;
  Header *fileHeader;
  DeepScanLineInputFile file;
  int in_stack_fffffffffffff7ec;
  undefined4 uVar21;
  int in_stack_fffffffffffff7f4;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 uVar22;
  undefined4 in_stack_fffffffffffff7fc;
  undefined4 in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff804;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff808;
  DeepFrameBuffer *in_stack_fffffffffffff810;
  undefined8 in_stack_fffffffffffff818;
  DeepScanLineInputFile *in_stack_fffffffffffff820;
  size_t in_stack_fffffffffffff828;
  ChannelList *in_stack_fffffffffffff830;
  ChannelList *in_stack_fffffffffffff838;
  char *in_stack_fffffffffffff840;
  long in_stack_fffffffffffff848;
  Array<Imf_2_5::Array2D<void_*>_> *in_stack_fffffffffffff850;
  undefined8 in_stack_fffffffffffff860;
  int in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffffa20;
  undefined7 in_stack_fffffffffffffa50;
  int local_588;
  int local_584;
  int local_580;
  int local_57c;
  uint local_554;
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  int local_538;
  int local_530;
  int local_52c;
  int local_528;
  int local_524;
  int local_520;
  int local_51c;
  string local_4e0 [32];
  stringstream local_4c0 [16];
  undefined1 local_4b0 [132];
  int in_stack_fffffffffffffbd4;
  char *in_stack_fffffffffffffbd8;
  DeepScanLineInputFile *in_stack_fffffffffffffbe0;
  DeepFrameBuffer *in_stack_fffffffffffffca0;
  DeepScanLineInputFile *in_stack_fffffffffffffca8;
  int local_328;
  string local_2e0 [32];
  stringstream local_2c0 [16];
  undefined1 local_2b0 [376];
  undefined4 local_138;
  int local_134;
  int local_130;
  vector<int,_std::allocator<int>_> local_128;
  Slice local_110 [2];
  int local_6c;
  Array local_68 [20];
  int local_54;
  Array2D<unsigned_int> local_50;
  Header *local_28;
  DeepScanLineInputFile local_20;
  byte local_e;
  byte local_d;
  int local_c;
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_c = in_ESI;
  if (local_e == 0) {
    poVar8 = std::operator<<((ostream *)&std::cout," reading all channels ");
    std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout," reading random channels ");
    std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  }
  std::__cxx11::string::c_str();
  Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
  local_28 = Imf_2_5::DeepScanLineInputFile::header(&local_20);
  Imf_2_5::Header::displayWindow((Header *)0x17310b);
  Imf_2_5::Header::displayWindow((Header *)0x173121);
  uVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                     (Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  if (!(bool)uVar4) {
    __assert_fail("fileHeader.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10a,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pBVar9 = Imf_2_5::Header::dataWindow((Header *)0x17319d);
  Imf_2_5::Header::dataWindow((Header *)0x1731b3);
  bVar5 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                     (Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  if (!bVar5) {
    __assert_fail("fileHeader.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10b,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar10 = Imf_2_5::Header::pixelAspectRatio((Header *)0x173216);
  fVar19 = *pfVar10;
  pfVar10 = Imf_2_5::Header::pixelAspectRatio((Header *)0x173241);
  if ((fVar19 != *pfVar10) || (NAN(fVar19) || NAN(*pfVar10))) {
    __assert_fail("fileHeader.pixelAspectRatio() == header.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10c,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  this = Imf_2_5::Header::screenWindowCenter((Header *)0x173291);
  v = Imf_2_5::Header::screenWindowCenter((Header *)0x1732a7);
  bVar5 = Imath_2_5::Vec2<float>::operator==(this,v);
  if (!bVar5) {
    __assert_fail("fileHeader.screenWindowCenter() == header.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10d,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar10 = Imf_2_5::Header::screenWindowWidth((Header *)0x17330a);
  fVar20 = *pfVar10;
  pfVar10 = Imf_2_5::Header::screenWindowWidth((Header *)0x173335);
  if ((fVar20 != *pfVar10) || (NAN(fVar20) || NAN(*pfVar10))) {
    __assert_fail("fileHeader.screenWindowWidth() == header.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10e,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pLVar11 = Imf_2_5::Header::lineOrder((Header *)0x173385);
  LVar1 = *pLVar11;
  pLVar11 = Imf_2_5::Header::lineOrder((Header *)0x1733ac);
  if (LVar1 != *pLVar11) {
    __assert_fail("fileHeader.lineOrder() == header.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10f,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pCVar12 = Imf_2_5::Header::compression((Header *)0x1733f7);
  CVar2 = *pCVar12;
  pCVar12 = Imf_2_5::Header::compression((Header *)0x17341e);
  if (CVar2 != *pCVar12) {
    __assert_fail("fileHeader.compression() == header.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x110,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  Imf_2_5::Header::channels((Header *)0x173469);
  Imf_2_5::Header::channels((Header *)0x17347f);
  bVar5 = Imf_2_5::ChannelList::operator==(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  if (!bVar5) {
    __assert_fail("fileHeader.channels() == header.channels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x111,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  Imf_2_5::Header::type_abi_cxx11_((Header *)0x1734e2);
  Imf_2_5::Header::type_abi_cxx11_((Header *)0x1734f8);
  _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  if (!_Var6) {
    __assert_fail("fileHeader.type() == header.type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x112,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  Imf_2_5::Array2D<unsigned_int>::Array2D(&local_50);
  Imf_2_5::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)in_stack_fffffffffffff810,(long)in_stack_fffffffffffff808,
             CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
  local_54 = random_int(in_stack_fffffffffffff7f4);
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::Array
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  for (local_6c = 0; local_6c < local_c + local_54; local_6c = local_6c + 1) {
    Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
    Imf_2_5::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)in_stack_fffffffffffff810,(long)in_stack_fffffffffffff808,
               CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
  }
  Imf_2_5::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffff810);
  puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,0);
  uVar22 = 0;
  uVar21 = 0;
  Imf_2_5::Slice::Slice
            (local_110,UINT,
             (char *)(puVar13 +
                     (-(long)(anonymous_namespace)::dataWindow - (long)(DAT_00564c3c * 0x111))),4,
             0x444,1,1,0.0,false,false);
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
            ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
             (Slice *)CONCAT44(in_stack_fffffffffffff7fc,uVar22));
  std::allocator<int>::allocator((allocator<int> *)0x17370c);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff810,
             (size_type)in_stack_fffffffffffff808,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
  std::allocator<int>::~allocator((allocator<int> *)0x173738);
  local_130 = 0;
  for (local_134 = 0; local_134 < local_c; local_134 = local_134 + 1) {
    if ((local_e & 1) != 0) {
      iVar7 = random_int(in_stack_fffffffffffff7f4);
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&local_128,(long)local_134);
      *pvVar14 = iVar7;
    }
    if (((local_e & 1) == 0) ||
       (pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&local_128,(long)local_134),
       *pvVar14 == 1)) {
      local_138 = 3;
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                           (long)local_134);
      if (*pvVar14 == 0) {
        local_138 = 0;
      }
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                           (long)local_134);
      if (*pvVar14 == 1) {
        local_138 = 1;
      }
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                           (long)local_134);
      if (*pvVar14 == 2) {
        local_138 = 2;
      }
      std::__cxx11::stringstream::stringstream(local_2c0);
      std::ostream::operator<<(local_2b0,local_134);
      std::__cxx11::stringstream::str();
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                 (long)local_134);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                 (long)local_134);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                 (long)local_134);
      pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
      Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_134,0);
      in_stack_fffffffffffff800 = 0;
      uVar22 = 0;
      uVar21 = 1;
      Imf_2_5::DeepSlice::DeepSlice
                ((DeepSlice *)in_stack_fffffffffffff850,
                 (PixelType)((ulong)in_stack_fffffffffffff848 >> 0x20),in_stack_fffffffffffff840,
                 (size_t)in_stack_fffffffffffff838,(size_t)in_stack_fffffffffffff830,
                 in_stack_fffffffffffff828,(int)in_stack_fffffffffffff860,in_stack_fffffffffffff868,
                 (double)in_stack_fffffffffffff820,SUB81((ulong)in_stack_fffffffffffff818 >> 0x38,0)
                 ,SUB81((ulong)in_stack_fffffffffffff818 >> 0x30,0));
      Imf_2_5::DeepFrameBuffer::insert
                ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                 (string *)CONCAT44(in_stack_fffffffffffff7fc,uVar22),
                 (DeepSlice *)CONCAT44(in_stack_fffffffffffff7f4,uVar21));
      local_130 = local_130 + 1;
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::stringstream::~stringstream(local_2c0);
    }
  }
  if (local_130 == 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"skipping ");
    std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  }
  else {
    for (local_328 = 0; local_328 < local_54; local_328 = local_328 + 1) {
      std::__cxx11::stringstream::stringstream(local_4c0);
      poVar8 = (ostream *)std::ostream::operator<<(local_4b0,local_328);
      std::operator<<(poVar8,"fill");
      std::__cxx11::stringstream::str();
      pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
      Imf_2_5::Array2D<void_*>::operator[](pAVar15 + (local_328 + local_c),0);
      in_stack_fffffffffffff800 = 0;
      uVar22 = 0;
      uVar21 = 1;
      Imf_2_5::DeepSlice::DeepSlice
                ((DeepSlice *)in_stack_fffffffffffff850,
                 (PixelType)((ulong)in_stack_fffffffffffff848 >> 0x20),in_stack_fffffffffffff840,
                 (size_t)in_stack_fffffffffffff838,(size_t)in_stack_fffffffffffff830,
                 in_stack_fffffffffffff828,(int)in_stack_fffffffffffff860,in_stack_fffffffffffff868,
                 (double)in_stack_fffffffffffff820,SUB81((ulong)in_stack_fffffffffffff818 >> 0x38,0)
                 ,SUB81((ulong)in_stack_fffffffffffff818 >> 0x30,0));
      Imf_2_5::DeepFrameBuffer::insert
                ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                 (string *)CONCAT44(in_stack_fffffffffffff7fc,uVar22),
                 (DeepSlice *)CONCAT44(in_stack_fffffffffffff7f4,uVar21));
      std::__cxx11::string::~string(local_4e0);
      std::__cxx11::stringstream::~stringstream(local_4c0);
    }
    Imf_2_5::DeepScanLineInputFile::setFrameBuffer
              (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if ((local_d & 1) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"per-line ");
      std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
      for (local_530 = 0; local_530 < (DAT_00564c44 - DAT_00564c3c) + 1; local_530 = local_530 + 1)
      {
        Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts
                  ((DeepScanLineInputFile *)CONCAT44(in_stack_fffffffffffff7f4,uVar21),
                   in_stack_fffffffffffff7ec);
        for (local_538 = 0; local_538 < 0x111; local_538 = local_538 + 1) {
          puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)local_530);
          uVar3 = puVar13[local_538];
          puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[]
                              ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                               (long)local_530);
          if (uVar3 != puVar13[local_538]) {
            __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                          ,0x199,
                          "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                         );
          }
        }
        for (local_53c = 0; local_53c < 0x111; local_53c = local_53c + 1) {
          for (local_540 = 0; local_540 < local_c; local_540 = local_540 + 1) {
            if (((local_e & 1) == 0) ||
               (pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_128,(long)local_540), *pvVar14 == 1)) {
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_540);
              if (*pvVar14 == 0) {
                puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)local_530);
                pvVar16 = operator_new__((ulong)puVar13[local_53c] << 2);
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_540,(long)local_530)
                ;
                ppvVar17[local_53c] = pvVar16;
              }
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_540);
              if (*pvVar14 == 1) {
                puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)local_530);
                pvVar16 = operator_new__((ulong)puVar13[local_53c] * 2);
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_540,(long)local_530)
                ;
                ppvVar17[local_53c] = pvVar16;
              }
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_540);
              if (*pvVar14 == 2) {
                puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)local_530);
                pvVar16 = operator_new__((ulong)puVar13[local_53c] << 2);
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_540,(long)local_530)
                ;
                ppvVar17[local_53c] = pvVar16;
              }
            }
          }
          for (local_544 = 0; local_544 < local_54; local_544 = local_544 + 1) {
            puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)local_530);
            pvVar16 = operator_new__((ulong)puVar13[local_53c] << 2);
            pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
            ppvVar17 = Imf_2_5::Array2D<void_*>::operator[]
                                 (pAVar15 + (local_544 + local_c),(long)local_530);
            ppvVar17[local_53c] = pvVar16;
          }
        }
        Imf_2_5::DeepScanLineInputFile::readPixels
                  ((DeepScanLineInputFile *)CONCAT44(in_stack_fffffffffffff7f4,uVar21),
                   in_stack_fffffffffffff7ec);
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,"bulk ");
      std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
      Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts
                ((DeepScanLineInputFile *)CONCAT44(fVar19,in_stack_fffffffffffffa20),
                 (int)((ulong)this >> 0x20),(int)this);
      for (local_51c = 0; local_51c < (DAT_00564c44 - DAT_00564c3c) + 1; local_51c = local_51c + 1)
      {
        for (local_520 = 0; local_520 < 0x111; local_520 = local_520 + 1) {
          puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)local_51c);
          uVar3 = puVar13[local_520];
          puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[]
                              ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                               (long)local_51c);
          if (uVar3 != puVar13[local_520]) {
            __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                          ,0x176,
                          "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                         );
          }
        }
        for (local_524 = 0; local_524 < 0x111; local_524 = local_524 + 1) {
          for (local_528 = 0; local_528 < local_c; local_528 = local_528 + 1) {
            if (((local_e & 1) == 0) ||
               (pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_128,(long)local_528), *pvVar14 == 1)) {
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_528);
              if (*pvVar14 == 0) {
                puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)local_51c);
                pvVar16 = operator_new__((ulong)puVar13[local_524] << 2);
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_528,(long)local_51c)
                ;
                ppvVar17[local_524] = pvVar16;
              }
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_528);
              if (*pvVar14 == 1) {
                puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)local_51c);
                pvVar16 = operator_new__((ulong)puVar13[local_524] * 2);
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_528,(long)local_51c)
                ;
                ppvVar17[local_524] = pvVar16;
              }
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_528);
              if (*pvVar14 == 2) {
                puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)local_51c);
                pvVar16 = operator_new__((ulong)puVar13[local_524] << 2);
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_528,(long)local_51c)
                ;
                ppvVar17[local_524] = pvVar16;
              }
            }
          }
          for (local_52c = 0; local_52c < local_54; local_52c = local_52c + 1) {
            puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)local_51c);
            pvVar16 = operator_new__((ulong)puVar13[local_524] << 2);
            pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
            ppvVar17 = Imf_2_5::Array2D<void_*>::operator[]
                                 (pAVar15 + (local_52c + local_c),(long)local_51c);
            ppvVar17[local_524] = pvVar16;
          }
        }
      }
      Imf_2_5::DeepScanLineInputFile::readPixels
                ((DeepScanLineInputFile *)CONCAT17(uVar4,in_stack_fffffffffffffa50),
                 (int)((ulong)pBVar9 >> 0x20),(int)pBVar9);
    }
    for (local_548 = 0; local_548 < 0xad; local_548 = local_548 + 1) {
      for (local_54c = 0; local_54c < 0x111; local_54c = local_54c + 1) {
        for (local_550 = 0; local_550 < local_c; local_550 = local_550 + 1) {
          if (((local_e & 1) == 0) ||
             (pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_128,(long)local_550), *pvVar14 == 1)) {
            for (local_554 = 0;
                puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                    ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                     (long)local_548), local_554 < puVar13[local_54c];
                local_554 = local_554 + 1) {
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_550);
              if (*pvVar14 == 0) {
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_550,(long)local_548)
                ;
                pvVar16 = ppvVar17[local_54c];
                if (*(uint *)((long)pvVar16 + (ulong)local_554 * 4) !=
                    (uint)(local_548 * 0x111 + local_54c) % 0x801) {
                  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,local_54c);
                  poVar8 = std::operator<<(poVar8,", ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_548);
                  poVar8 = std::operator<<(poVar8," error, should be ");
                  poVar8 = (ostream *)
                           std::ostream::operator<<(poVar8,(local_548 * 0x111 + local_54c) % 0x801);
                  poVar8 = std::operator<<(poVar8,", is ");
                  pvVar18 = (void *)std::ostream::operator<<
                                              (poVar8,*(uint *)((long)pvVar16 + (ulong)local_554 * 4
                                                               ));
                  pvVar18 = (void *)std::ostream::operator<<
                                              (pvVar18,std::endl<char,std::char_traits<char>>);
                  std::ostream::operator<<(pvVar18,std::flush<char,std::char_traits<char>>);
                }
                if (*(uint *)((long)pvVar16 + (ulong)local_554 * 4) !=
                    (uint)(local_548 * 0x111 + local_54c) % 0x801) {
                  __assert_fail("value[l] == static_cast<unsigned int>(i * width + j) % 2049",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                ,0x1c3,
                                "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                               );
                }
              }
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_550);
              if (*pvVar14 == 1) {
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_550,(long)local_548)
                ;
                pvVar16 = ppvVar17[local_54c];
                fVar19 = half::operator_cast_to_float
                                   ((half *)((long)pvVar16 + (ulong)local_554 * 2));
                fVar20 = (float)((local_548 * 0x111 + local_54c) % 0x801);
                if ((fVar19 != fVar20) || (NAN(fVar19) || NAN(fVar20))) {
                  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,local_54c);
                  poVar8 = std::operator<<(poVar8,", ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_548);
                  poVar8 = std::operator<<(poVar8," error, should be ");
                  poVar8 = (ostream *)
                           std::ostream::operator<<(poVar8,(local_548 * 0x111 + local_54c) % 0x801);
                  poVar8 = std::operator<<(poVar8,", is ");
                  pvVar16 = (void *)::operator<<(poVar8,(half)*(unsigned_short *)
                                                               ((long)pvVar16 + (ulong)local_554 * 2
                                                               ));
                  pvVar16 = (void *)std::ostream::operator<<
                                              (pvVar16,std::endl<char,std::char_traits<char>>);
                  std::ostream::operator<<(pvVar16,std::flush<char,std::char_traits<char>>);
                }
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_550,(long)local_548)
                ;
                fVar19 = half::operator_cast_to_float
                                   ((half *)((long)ppvVar17[local_54c] + (ulong)local_554 * 2));
                fVar20 = (float)((local_548 * 0x111 + local_54c) % 0x801);
                if ((fVar19 != fVar20) || (NAN(fVar19) || NAN(fVar20))) {
                  __assert_fail("((half*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                ,0x1cc,
                                "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                               );
                }
              }
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_550);
              if (*pvVar14 == 2) {
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_550,(long)local_548)
                ;
                pvVar16 = ppvVar17[local_54c];
                fVar19 = *(float *)((long)pvVar16 + (ulong)local_554 * 4);
                fVar20 = (float)((local_548 * 0x111 + local_54c) % 0x801);
                if ((fVar19 != fVar20) || (NAN(fVar19) || NAN(fVar20))) {
                  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,local_54c);
                  poVar8 = std::operator<<(poVar8,", ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_548);
                  poVar8 = std::operator<<(poVar8," error, should be ");
                  poVar8 = (ostream *)
                           std::ostream::operator<<(poVar8,(local_548 * 0x111 + local_54c) % 0x801);
                  poVar8 = std::operator<<(poVar8,", is ");
                  pvVar16 = (void *)std::ostream::operator<<
                                              (poVar8,*(float *)((long)pvVar16 +
                                                                (ulong)local_554 * 4));
                  pvVar16 = (void *)std::ostream::operator<<
                                              (pvVar16,std::endl<char,std::char_traits<char>>);
                  std::ostream::operator<<(pvVar16,std::flush<char,std::char_traits<char>>);
                }
                pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_550,(long)local_548)
                ;
                fVar19 = *(float *)((long)ppvVar17[local_54c] + (ulong)local_554 * 4);
                fVar20 = (float)((local_548 * 0x111 + local_54c) % 0x801);
                if ((fVar19 != fVar20) || (NAN(fVar19) || NAN(fVar20))) {
                  __assert_fail("((float*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                ,0x1d5,
                                "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                               );
                }
              }
            }
          }
        }
      }
    }
    for (local_57c = 0; local_57c < 0xad; local_57c = local_57c + 1) {
      for (local_580 = 0; local_580 < 0x111; local_580 = local_580 + 1) {
        for (local_584 = 0; local_584 < local_c; local_584 = local_584 + 1) {
          if (((local_e & 1) == 0) ||
             (pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_128,(long)local_584), *pvVar14 == 1)) {
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::channelTypes,(long)local_584);
            if (*pvVar14 == 0) {
              pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
              ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_584,(long)local_57c);
              in_stack_fffffffffffff820 = (DeepScanLineInputFile *)ppvVar17[local_580];
              if (in_stack_fffffffffffff820 != (DeepScanLineInputFile *)0x0) {
                operator_delete__(in_stack_fffffffffffff820);
              }
            }
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::channelTypes,(long)local_584);
            if (*pvVar14 == 1) {
              pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
              ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_584,(long)local_57c);
              if (ppvVar17[local_580] != (void *)0x0) {
                operator_delete__(ppvVar17[local_580]);
              }
            }
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::channelTypes,(long)local_584);
            if (*pvVar14 == 2) {
              pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
              ppvVar17 = Imf_2_5::Array2D<void_*>::operator[](pAVar15 + local_584,(long)local_57c);
              in_stack_fffffffffffff810 = (DeepFrameBuffer *)ppvVar17[local_580];
              if (in_stack_fffffffffffff810 != (DeepFrameBuffer *)0x0) {
                operator_delete__(in_stack_fffffffffffff810);
              }
            }
          }
        }
        for (local_588 = 0; local_588 < local_54; local_588 = local_588 + 1) {
          pAVar15 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
          ppvVar17 = Imf_2_5::Array2D<void_*>::operator[]
                               (pAVar15 + (local_588 + local_c),(long)local_57c);
          if (ppvVar17[local_580] != (void *)0x0) {
            operator_delete__(ppvVar17[local_580]);
          }
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
  Imf_2_5::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x17509c);
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array
            ((Array<Imf_2_5::Array2D<void_*>_> *)in_stack_fffffffffffff810);
  Imf_2_5::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff7f4,uVar21));
  Imf_2_5::DeepScanLineInputFile::~DeepScanLineInputFile(in_stack_fffffffffffff820);
  return;
}

Assistant:

void readFile (const std::string & filename,
               int channelCount,
               bool bulkRead,
               bool randomChannels)
{
    if(randomChannels)
    {
      cout << " reading random channels " << flush;
    }
    else
    {
      cout << " reading all channels " << flush;
    }
    
    DeepScanLineInputFile file(filename.c_str(), 8);

    const Header& fileHeader = file.header();
    assert (fileHeader.displayWindow() == header.displayWindow());
    assert (fileHeader.dataWindow() == header.dataWindow());
    assert (fileHeader.pixelAspectRatio() == header.pixelAspectRatio());
    assert (fileHeader.screenWindowCenter() == header.screenWindowCenter());
    assert (fileHeader.screenWindowWidth() == header.screenWindowWidth());
    assert (fileHeader.lineOrder() == header.lineOrder());
    assert (fileHeader.compression() == header.compression());
    assert (fileHeader.channels() == header.channels());
    assert (fileHeader.type() == header.type());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase(height, width);
    
        
    // also test filling channels. Generate up to 2 extra channels
    int fillChannels=random_int(3);
    
    Array<Array2D< void* > > data(channelCount+fillChannels);
    for (int i = 0; i < channelCount+fillChannels; i++)
        data[i].resizeErase(height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,                    // type // 7
                                        (char *) (&localSampleCount[0][0]
                                                  - dataWindow.min.x
                                                  - dataWindow.min.y * width),               // base // 8)
                                        sizeof (unsigned int) * 1,          // xStride// 9
                                        sizeof (unsigned int) * width));    // yStride// 10

    vector<int> read_channel(channelCount);
    
    
    int channels_added=0;
    
    for (int i = 0; i < channelCount; i++)
    {
        if(randomChannels)
        {
	     read_channel[i] = random_int(2);
	     
        }
        if(!randomChannels || read_channel[i]==1)
	{
            PixelType type = NUM_PIXELTYPES;
            if (channelTypes[i] == 0)
                type = IMF::UINT;
            if (channelTypes[i] == 1)
                type = IMF::HALF;
            if (channelTypes[i] == 2)
                type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char *);

            frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
	    channels_added++;
        }
    }
    
    
    if(channels_added==0)
    {
      cout << "skipping " <<flush;
      return;
    }
    for(int i = 0 ; i < fillChannels ; ++i )
    { 
            PixelType type  = IMF::FLOAT;
            int sampleSize = sizeof(float);            
            int pointerSize = sizeof (char *);
            stringstream ss;
            // generate channel names that aren't in file but (might) interleave with existing file
            ss << i << "fill";
            string str = ss.str();
               frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i+channelCount][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
    }
    file.setFrameBuffer(frameBuffer);

    if (bulkRead)
    {
        cout << "bulk " << flush;
        file.readPixelSampleCounts(dataWindow.min.y, dataWindow.max.y);
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            for (int j = 0; j < width; j++)
                assert(localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if(!randomChannels || read_channel[k]==1)
                    {
                                if (channelTypes[k] == 0)
                                    data[k][i][j] = new unsigned int[localSampleCount[i][j]];
                                if (channelTypes[k] == 1)
                                    data[k][i][j] = new half[localSampleCount[i][j]];
                                if (channelTypes[k] == 2)
                                    data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                }
                for( int f = 0 ; f < fillChannels ; ++f )
                {
                       data[f+channelCount][i][j] = new float[localSampleCount[i][j]];
                }
            }
        }
        
        file.readPixels(dataWindow.min.y, dataWindow.max.y);
    }
    
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            int y = i + dataWindow.min.y;
            file.readPixelSampleCounts(y);

            for (int j = 0; j < width; j++)
                assert(localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if( !randomChannels || read_channel[k]==1)
                    {
                                if (channelTypes[k] == 0)
                                    data[k][i][j] = new unsigned int[localSampleCount[i][j]];
                                if (channelTypes[k] == 1)
                                    data[k][i][j] = new half[localSampleCount[i][j]];
                                if (channelTypes[k] == 2)
                                    data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                }
                for( int f = 0 ; f < fillChannels ; ++f )
                {
                       data[f+channelCount][i][j] = new float[localSampleCount[i][j]];
                }
            }

            file.readPixels(y);
	    
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if( !randomChannels || read_channel[k]==1 )
                {
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                        {
                            unsigned int* value = (unsigned int*)(data[k][i][j]);
                            if (value[l] != static_cast<unsigned int>(i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (value[l] == static_cast<unsigned int>(i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 1)
                        {
                            half* value = (half*)(data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (((half*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 2)
                        {
                            float* value = (float*)(data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (((float*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                        }
                    }
                }
            }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
        {
            for (int k = 0; k < channelCount; k++)
            {
                if( !randomChannels || read_channel[k]==1 )
                {
                    if (channelTypes[k] == 0)
                        delete[] (unsigned int*) data[k][i][j];
                    if (channelTypes[k] == 1)
                        delete[] (half*) data[k][i][j];
                    if (channelTypes[k] == 2)
                        delete[] (float*) data[k][i][j];
                }
            }
            for( int f = 0 ; f < fillChannels ; ++f )
            {
                 delete[] (float*) data[f+channelCount][i][j];
            }
       }
}